

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O1

void __thiscall Assimp::glTF2Exporter::ExportMeshes(glTF2Exporter *this)

{
  float fVar1;
  float fVar2;
  Asset *pAVar3;
  element_type *peVar4;
  aiMesh *paVar5;
  Node *pNVar6;
  pointer pRVar7;
  iterator iVar8;
  aiVector3D *paVar9;
  Skin *pSVar10;
  undefined8 *puVar11;
  iterator __position;
  bool bVar12;
  pointer puVar13;
  vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *pvVar14;
  pointer paVar15;
  pointer paVar16;
  uint n;
  aiScene *paVar17;
  vector<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_> *pvVar18;
  long lVar19;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar20;
  ulong uVar21;
  void *data;
  pointer ppMVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint indexColorChannel;
  ulong uVar27;
  int i;
  long lVar28;
  float fVar29;
  Ref<glTF2::Buffer> RVar30;
  Ref<glTF2::Skin> RVar31;
  Ref<glTF2::Mesh> RVar32;
  Ref<glTF2::Accessor> RVar33;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  string name;
  Ref<glTF2::Skin> local_178;
  Ref<glTF2::Buffer> local_168;
  string skinName;
  Ref<glTF2::Mesh> local_128;
  string meshId;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> inverseBindMatricesData;
  Ref<glTF2::Accessor> local_d0;
  Ref<glTF2::Accessor> local_c0;
  string local_b0;
  string bufferIdPrefix;
  string bufferId;
  string fname;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fname,this->mFilename,(allocator<char> *)&bufferIdPrefix);
  std::__cxx11::string::rfind((char *)&fname,0x6ccd24,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&bufferIdPrefix,(ulong)&fname);
  pAVar3 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  skinName._M_dataplus._M_p = (pointer)&skinName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&skinName,"");
  glTF2::Asset::FindUniqueID(&bufferId,pAVar3,&skinName,bufferIdPrefix._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)skinName._M_dataplus._M_p != &skinName.field_2) {
    operator_delete(skinName._M_dataplus._M_p,skinName.field_2._M_allocated_capacity + 1);
  }
  peVar4 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_168.vector = (peVar4->mBodyBuffer).vector;
  local_168.index = (peVar4->mBodyBuffer).index;
  if (local_168.vector == (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0) {
    RVar30 = glTF2::LazyDict<glTF2::Buffer>::Create(&peVar4->buffers,bufferId._M_dataplus._M_p);
    local_168.vector = RVar30.vector;
    local_168.index = RVar30.index;
  }
  uVar26 = this->mScene->mNumMeshes;
  if (uVar26 == 0) {
    bVar12 = false;
  }
  else {
    lVar28 = 0;
    do {
      paVar5 = this->mScene->mMeshes[lVar28];
      bVar12 = false;
      if (paVar5->mBones != (aiBone **)0x0 && paVar5->mNumBones != 0) {
        bVar12 = true;
        break;
      }
      iVar23 = (int)lVar28;
      lVar28 = lVar28 + 1;
    } while (uVar26 - 1 != iVar23);
  }
  local_178.vector = (vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *)0x0;
  local_178.index = 0;
  pAVar3 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"skin","");
  glTF2::Asset::FindUniqueID(&skinName,pAVar3,&name,"skin");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar12) {
    RVar31 = glTF2::LazyDict<glTF2::Skin>::Create
                       (&((this->mAsset).
                          super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         skins,skinName._M_dataplus._M_p);
    local_178.vector = RVar31.vector;
    local_178.index = RVar31.index;
    std::__cxx11::string::_M_assign
              ((string *)
               &((local_178.vector)->
                super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                super__Vector_impl_data._M_start[local_178.index]->name);
  }
  paVar17 = this->mScene;
  if (paVar17->mNumMeshes == 0) {
LAB_00398425:
    paVar16 = inverseBindMatricesData.
              super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
    paVar15 = inverseBindMatricesData.
              super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (bVar12) {
      uVar24 = (long)inverseBindMatricesData.
                     super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)inverseBindMatricesData.
                     super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 6;
      data = operator_new__(-(ulong)(uVar24 >> 0x3a != 0) |
                            (long)inverseBindMatricesData.
                                  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)inverseBindMatricesData.
                                  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      if (paVar16 != paVar15) {
        uVar27 = 1;
        uVar21 = 0;
        do {
          uVar25 = uVar27;
          CopyValue(paVar15 + uVar21,(mat4 *)(uVar21 * 0x40 + (long)data));
          uVar27 = (ulong)((int)uVar25 + 1);
          uVar21 = uVar25;
        } while (uVar25 < uVar24);
      }
      RVar33 = ExportData((this->mAsset).
                          super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &skinName,&local_168,uVar24 & 0xffffffff,data,MAT4,MAT4,
                          ComponentType_FLOAT,false);
      pvVar14 = local_178.vector;
      if (RVar33.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
        pSVar10 = ((local_178.vector)->
                  super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[local_178.index];
        (pSVar10->inverseBindMatrices).vector = RVar33.vector;
        (pSVar10->inverseBindMatrices).index = RVar33.index;
      }
      uVar24 = (ulong)local_178.index;
      (((local_178.vector)->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
       _M_impl.super__Vector_impl_data._M_start[uVar24]->bindShapeMatrix).isPresent = true;
      pSVar10 = ((local_178.vector)->
                super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar24];
      (pSVar10->bindShapeMatrix).value[0] = 1.0;
      (pSVar10->bindShapeMatrix).value[1] = 0.0;
      (pSVar10->bindShapeMatrix).value[2] = 0.0;
      (pSVar10->bindShapeMatrix).value[3] = 0.0;
      (pSVar10->bindShapeMatrix).value[4] = 0.0;
      (pSVar10->bindShapeMatrix).value[5] = 1.0;
      (pSVar10->bindShapeMatrix).value[6] = 0.0;
      (pSVar10->bindShapeMatrix).value[7] = 0.0;
      (pSVar10->bindShapeMatrix).value[8] = 0.0;
      (pSVar10->bindShapeMatrix).value[9] = 0.0;
      (pSVar10->bindShapeMatrix).value[10] = 1.0;
      (pSVar10->bindShapeMatrix).value[0xb] = 0.0;
      (pSVar10->bindShapeMatrix).value[0xc] = 0.0;
      (pSVar10->bindShapeMatrix).value[0xd] = 0.0;
      (pSVar10->bindShapeMatrix).value[0xe] = 0.0;
      (pSVar10->bindShapeMatrix).value[0xf] = 1.0;
      meshId._M_dataplus._M_p =
           (pointer)&(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->nodes).mObjs;
      meshId._M_string_length._0_4_ = 0;
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      peVar4 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ppMVar22 = (peVar4->meshes).mObjs.
                 super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)*(pointer *)
                               ((long)&(peVar4->meshes).mObjs.
                                       super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                       ._M_impl.super__Vector_impl_data + 8) - (long)ppMVar22) >> 3)
          != 0) {
        uVar27 = 0;
        do {
          lVar28 = *(long *)&(ppMVar22[uVar27]->primitives).
                             super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
          ;
          lVar19 = (long)*(pointer *)((long)&ppMVar22[uVar27]->primitives + 8) - lVar28;
          if (lVar19 != 0) {
            uVar26 = 1;
            uVar21 = 0;
LAB_003985af:
            if (*(long *)(lVar28 + 0xb0 + uVar21 * 0x100) ==
                *(long *)(lVar28 + 0xb8 + uVar21 * 0x100)) goto code_r0x003985c5;
            name._M_dataplus._M_p = (pointer)&name.field_2;
            lVar28 = *(long *)&((string *)((long)&ppMVar22[uVar27]->super_Object + 0x10))->
                               _M_dataplus;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&name,lVar28,
                       *(size_type *)((long)&ppMVar22[uVar27]->super_Object + 0x18) + lVar28);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,name._M_dataplus._M_p,
                       name._M_dataplus._M_p + name._M_string_length);
            FindMeshNode((Ref<glTF2::Node> *)&meshId,(Ref<glTF2::Node> *)&indices,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            puVar13 = indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar11 = *(undefined8 **)
                       &((pvVar14->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar24]->jointNames).
                        super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                        ._M_impl.super__Vector_impl_data;
            local_128.vector = (vector<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_> *)*puVar11;
            uVar21 = (ulong)*(uint *)(puVar11 + 1);
            do {
              pNVar6 = (((_Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
                        &(local_128.vector)->
                         super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)->_M_impl
                       ).super__Vector_impl_data._M_start[uVar21];
              local_128.vector =
                   (vector<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_> *)(pNVar6->parent).vector;
              local_128.index = (pNVar6->parent).index;
              uVar21 = (ulong)local_128.index;
            } while (((((_Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
                       &(local_128.vector)->
                        super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)->_M_impl)
                      .super__Vector_impl_data._M_start[uVar21]->jointName)._M_string_length != 0);
            uVar21 = (ulong)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffff;
            lVar28 = *(long *)(*(long *)indices.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar21 * 8);
            __position._M_current = *(Ref<glTF2::Node> **)(lVar28 + 0x120);
            if (__position._M_current == *(Ref<glTF2::Node> **)(lVar28 + 0x128)) {
              std::vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>>::
              _M_realloc_insert<glTF2::Ref<glTF2::Node>const&>
                        ((vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>> *)
                         (lVar28 + 0x118),__position,(Ref<glTF2::Node> *)&local_128);
            }
            else {
              (__position._M_current)->vector =
                   (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)local_128.vector;
              *(ulong *)&(__position._M_current)->index = CONCAT44(local_128._12_4_,local_128.index)
              ;
              *(long *)(lVar28 + 0x120) = *(long *)(lVar28 + 0x120) + 0x10;
            }
            lVar28 = *(long *)(*(long *)puVar13 + uVar21 * 8);
            *(uint *)(lVar28 + 0x138) = local_178.index;
            *(vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> **)(lVar28 + 0x130) =
                 local_178.vector;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
          }
LAB_0039872f:
          uVar27 = uVar27 + 1;
          peVar4 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          ppMVar22 = (peVar4->meshes).mObjs.
                     super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (uVar27 < ((ulong)((long)*(pointer *)
                                          ((long)&(peVar4->meshes).mObjs.
                                                  super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                  (long)ppMVar22) >> 3 & 0xffffffff));
      }
      operator_delete__(data);
    }
    if (inverseBindMatricesData.
        super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(inverseBindMatricesData.
                      super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)inverseBindMatricesData.
                            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)inverseBindMatricesData.
                            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)skinName._M_dataplus._M_p != &skinName.field_2) {
      operator_delete(skinName._M_dataplus._M_p,skinName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bufferId._M_dataplus._M_p != &bufferId.field_2) {
      operator_delete(bufferId._M_dataplus._M_p,bufferId.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bufferIdPrefix._M_dataplus._M_p != &bufferIdPrefix.field_2) {
      operator_delete(bufferIdPrefix._M_dataplus._M_p,
                      bufferIdPrefix.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fname._M_dataplus._M_p != &fname.field_2) {
      operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  uVar24 = 0;
LAB_00397e85:
  paVar5 = paVar17->mMeshes[uVar24];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,(paVar5->mName).data,(allocator<char> *)&meshId);
  glTF2::Asset::FindUniqueID
            (&meshId,(this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&name,"mesh");
  RVar32 = glTF2::LazyDict<glTF2::Mesh>::Create
                     (&((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->meshes,meshId._M_dataplus._M_p);
  pvVar18 = RVar32.vector;
  uVar26 = RVar32.index;
  local_128.vector = pvVar18;
  local_128.index = uVar26;
  std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::resize
            ((vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_> *)
             &(((_Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
               &pvVar18->super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)->_M_impl
              ).super__Vector_impl_data._M_start[uVar26]->children,1);
  pNVar6 = (((_Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
            &pvVar18->super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)->_M_impl).
           super__Vector_impl_data._M_start[uVar26];
  pRVar7 = *(pointer *)
            ((long)&(pNVar6->children).
                    super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                    ._M_impl + 8);
  std::__cxx11::string::_M_assign((string *)&(pNVar6->super_Object).name);
  uVar26 = paVar5->mMaterialIndex;
  *(vector<glTF2::Material_*,_std::allocator<glTF2::Material_*>_> **)&pRVar7[-3].index =
       &(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        materials).mObjs;
  *(uint *)&pRVar7[-2].vector = uVar26;
  RVar33 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,&meshId,&local_168,(ulong)paVar5->mNumVertices,paVar5->mVertices,VEC3,
                      VEC3,ComponentType_FLOAT,false);
  local_c0.vector = RVar33.vector;
  local_c0.index = RVar33.index;
  if (local_c0.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
    iVar8._M_current = (Ref<glTF2::Accessor> *)pRVar7[-0xf].vector;
    if (iVar8._M_current == *(Ref<glTF2::Accessor> **)&pRVar7[-0xf].index) {
      std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
      _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>> *)
                 &pRVar7[-0x10].index,iVar8,&local_c0);
    }
    else {
      (iVar8._M_current)->vector = local_c0.vector;
      *(ulong *)&(iVar8._M_current)->index = CONCAT44(local_c0._12_4_,local_c0.index);
      pRVar7[-0xf].vector =
           (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
           ((long)&((pRVar7[-0xf].vector)->
                   super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl + 0x10
           );
    }
  }
  if ((paVar5->mNormals != (aiVector3D *)0x0) && (paVar5->mNumVertices != 0)) {
    lVar28 = 8;
    uVar27 = 0;
    do {
      paVar9 = paVar5->mNormals;
      fVar29 = *(float *)((long)paVar9 + lVar28 + -8);
      fVar1 = *(float *)((long)paVar9 + lVar28 + -4);
      fVar2 = *(float *)((long)&paVar9->x + lVar28);
      fVar29 = fVar2 * fVar2 + fVar29 * fVar29 + fVar1 * fVar1;
      if (fVar29 < 0.0) {
        fVar29 = sqrtf(fVar29);
      }
      else {
        fVar29 = SQRT(fVar29);
      }
      fVar29 = 1.0 / fVar29;
      *(float *)((long)paVar9 + lVar28 + -8) = *(float *)((long)paVar9 + lVar28 + -8) * fVar29;
      *(float *)((long)paVar9 + lVar28 + -4) = *(float *)((long)paVar9 + lVar28 + -4) * fVar29;
      *(float *)((long)&paVar9->x + lVar28) = fVar29 * *(float *)((long)&paVar9->x + lVar28);
      uVar27 = uVar27 + 1;
      lVar28 = lVar28 + 0xc;
    } while (uVar27 < paVar5->mNumVertices);
  }
  RVar33 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,&meshId,&local_168,(ulong)paVar5->mNumVertices,paVar5->mNormals,VEC3,
                      VEC3,ComponentType_FLOAT,false);
  local_d0.vector = RVar33.vector;
  local_d0.index = RVar33.index;
  if (local_d0.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
    iVar8._M_current = *(Ref<glTF2::Accessor> **)&pRVar7[-0xe].index;
    if (iVar8._M_current == (Ref<glTF2::Accessor> *)pRVar7[-0xd].vector) {
      std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
      _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>> *)
                 (pRVar7 + -0xe),iVar8,&local_d0);
    }
    else {
      local_d0.vector._0_4_ = RVar33.vector._0_4_;
      local_d0.vector._4_4_ = RVar33.vector._4_4_;
      *(undefined4 *)&(iVar8._M_current)->vector = local_d0.vector._0_4_;
      *(undefined4 *)((long)&(iVar8._M_current)->vector + 4) = local_d0.vector._4_4_;
      (iVar8._M_current)->index = local_d0.index;
      *(undefined4 *)&(iVar8._M_current)->field_0xc = local_d0._12_4_;
      *(long *)&pRVar7[-0xe].index = *(long *)&pRVar7[-0xe].index + 0x10;
    }
  }
  lVar28 = 0;
  do {
    if ((paVar5->mTextureCoords[lVar28] != (aiVector3D *)0x0) && (paVar5->mNumVertices != 0)) {
      if ((1 < paVar5->mNumUVComponents[lVar28]) && (paVar5->mNumVertices != 0)) {
        lVar19 = 4;
        uVar27 = 0;
        do {
          *(float *)((long)&paVar5->mTextureCoords[lVar28]->x + lVar19) =
               1.0 - *(float *)((long)&paVar5->mTextureCoords[lVar28]->x + lVar19);
          uVar27 = uVar27 + 1;
          lVar19 = lVar19 + 0xc;
        } while (uVar27 < paVar5->mNumVertices);
      }
      if (paVar5->mNumUVComponents[lVar28] != 0) {
        RVar33 = ExportData((this->mAsset).
                            super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            &meshId,&local_168,(ulong)paVar5->mNumVertices,
                            paVar5->mTextureCoords[lVar28],VEC3,
                            (paVar5->mNumUVComponents[lVar28] != 2) + VEC2,ComponentType_FLOAT,false
                           );
        pvVar20 = RVar33.vector;
        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(indices.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,RVar33.index);
        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pvVar20;
        if (pvVar20 != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
          iVar8._M_current = *(Ref<glTF2::Accessor> **)&pRVar7[-0xb].index;
          if (iVar8._M_current == (Ref<glTF2::Accessor> *)pRVar7[-10].vector) {
            std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
            _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                      ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>
                        *)(pRVar7 + -0xb),iVar8,(Ref<glTF2::Accessor> *)&indices);
          }
          else {
            indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = RVar33.vector._0_4_;
            indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ = RVar33.vector._4_4_;
            *(undefined4 *)&(iVar8._M_current)->vector =
                 indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_;
            *(undefined4 *)((long)&(iVar8._M_current)->vector + 4) =
                 indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_;
            (iVar8._M_current)->index = RVar33.index;
            *(undefined4 *)&(iVar8._M_current)->field_0xc =
                 indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_;
            *(long *)&pRVar7[-0xb].index = *(long *)&pRVar7[-0xb].index + 0x10;
          }
        }
      }
    }
    lVar28 = lVar28 + 1;
  } while (lVar28 != 8);
  uVar27 = 0;
  do {
    uVar21 = 0;
    do {
      if (paVar5->mColors[uVar21] == (aiColor4D *)0x0) goto LAB_00398208;
      uVar21 = uVar21 + 1;
    } while (uVar21 != 8);
    uVar21 = 8;
LAB_00398208:
    if (uVar21 <= uVar27) break;
    RVar33 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&meshId,&local_168,(ulong)paVar5->mNumVertices,
                        paVar5->mColors[uVar27],VEC4,VEC4,ComponentType_FLOAT,false);
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)RVar33.vector;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_,RVar33.index);
    if ((vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
      iVar8._M_current = (Ref<glTF2::Accessor> *)pRVar7[-9].vector;
      if (iVar8._M_current == *(Ref<glTF2::Accessor> **)&pRVar7[-9].index) {
        std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
        _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                  ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>
                    *)&pRVar7[-10].index,iVar8,(Ref<glTF2::Accessor> *)&indices);
      }
      else {
        (iVar8._M_current)->vector =
             (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
             indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)&(iVar8._M_current)->index =
             indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pRVar7[-9].vector =
             (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
             ((long)&((pRVar7[-9].vector)->
                     super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl +
             0x10);
      }
    }
    uVar27 = uVar27 + 1;
  } while( true );
  if (paVar5->mNumFaces != 0) {
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar26 = paVar5->mFaces->mNumIndices;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&indices,(ulong)(paVar5->mNumFaces * uVar26));
    if (paVar5->mNumFaces != 0) {
      lVar28 = 0;
      uVar27 = 0;
      do {
        if (uVar26 != 0) {
          uVar21 = 0;
          do {
            *(uint *)((long)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar21 * 4 + lVar28) =
                 paVar5->mFaces[uVar27].mIndices[uVar21];
            uVar21 = uVar21 + 1;
          } while (uVar26 != uVar21);
        }
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + (ulong)uVar26 * 4;
      } while (uVar27 < paVar5->mNumFaces);
    }
    RVar33 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&meshId,&local_168,
                        (long)indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2,
                        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,SCALAR,SCALAR,
                        ComponentType_UNSIGNED_INT,true);
    *(vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> **)&pRVar7[-4].index =
         RVar33.vector;
    *(uint *)&pRVar7[-3].vector = RVar33.index;
    if (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  iVar23 = (uint)(paVar5->mPrimitiveTypes != 2) * 3 + 1;
  if (paVar5->mPrimitiveTypes == 1) {
    iVar23 = 0;
  }
  *(int *)&pRVar7[-0x10].vector = iVar23;
  if ((paVar5->mBones != (aiBone **)0x0) && (paVar5->mNumBones != 0)) {
    ExportSkin((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               paVar5,&local_128,&local_168,&local_178,&inverseBindMatricesData);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)meshId._M_dataplus._M_p != &meshId.field_2) {
    operator_delete(meshId._M_dataplus._M_p,meshId.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  uVar24 = uVar24 + 1;
  paVar17 = this->mScene;
  if (paVar17->mNumMeshes <= uVar24) goto LAB_00398425;
  goto LAB_00397e85;
code_r0x003985c5:
  uVar21 = (ulong)uVar26;
  uVar26 = uVar26 + 1;
  if ((ulong)(lVar19 >> 8) <= uVar21) goto LAB_0039872f;
  goto LAB_003985af;
}

Assistant:

void glTF2Exporter::ExportMeshes()
{
    typedef decltype(aiFace::mNumIndices) IndicesType;

    std::string fname = std::string(mFilename);
    std::string bufferIdPrefix = fname.substr(0, fname.rfind(".gltf"));
    std::string bufferId = mAsset->FindUniqueID("", bufferIdPrefix.c_str());

    Ref<Buffer> b = mAsset->GetBodyBuffer();
    if (!b) {
       b = mAsset->buffers.Create(bufferId);
    }

    //----------------------------------------
    // Initialize variables for the skin
    bool createSkin = false;
    for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
        const aiMesh* aim = mScene->mMeshes[idx_mesh];
        if(aim->HasBones()) {
            createSkin = true;
            break;
        }
    }

    Ref<Skin> skinRef;
    std::string skinName = mAsset->FindUniqueID("skin", "skin");
    std::vector<aiMatrix4x4> inverseBindMatricesData;
    if(createSkin) {
        skinRef = mAsset->skins.Create(skinName);
        skinRef->name = skinName;
    }
    //----------------------------------------

	for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
		const aiMesh* aim = mScene->mMeshes[idx_mesh];

        std::string name = aim->mName.C_Str();

        std::string meshId = mAsset->FindUniqueID(name, "mesh");
        Ref<Mesh> m = mAsset->meshes.Create(meshId);
        m->primitives.resize(1);
        Mesh::Primitive& p = m->primitives.back();

        m->name = name;

        p.material = mAsset->materials.Get(aim->mMaterialIndex);

		/******************* Vertices ********************/
        Ref<Accessor> v = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mVertices, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (v) p.attributes.position.push_back(v);

		/******************** Normals ********************/
        // Normalize all normals as the validator can emit a warning otherwise
        if ( nullptr != aim->mNormals) {
            for ( auto i = 0u; i < aim->mNumVertices; ++i ) {
                aim->mNormals[ i ].Normalize();
            }
        }

		Ref<Accessor> n = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mNormals, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
        if (n) p.attributes.normal.push_back(n);

		/************** Texture coordinates **************/
        for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
			if (!aim->HasTextureCoords(i))
				continue;
			
            // Flip UV y coords
            if (aim -> mNumUVComponents[i] > 1) {
                for (unsigned int j = 0; j < aim->mNumVertices; ++j) {
                    aim->mTextureCoords[i][j].y = 1 - aim->mTextureCoords[i][j].y;
                }
            }

            if (aim->mNumUVComponents[i] > 0) {
                AttribType::Value type = (aim->mNumUVComponents[i] == 2) ? AttribType::VEC2 : AttribType::VEC3;

				Ref<Accessor> tc = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mTextureCoords[i], AttribType::VEC3, type, ComponentType_FLOAT, false);
				if (tc) p.attributes.texcoord.push_back(tc);
			}
		}

		/*************** Vertex colors ****************/
		for (unsigned int indexColorChannel = 0; indexColorChannel < aim->GetNumColorChannels(); ++indexColorChannel) {
			Ref<Accessor> c = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mColors[indexColorChannel], AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT, false);
			if (c)
				p.attributes.color.push_back(c);
		}

		/*************** Vertices indices ****************/
		if (aim->mNumFaces > 0) {
			std::vector<IndicesType> indices;
			unsigned int nIndicesPerFace = aim->mFaces[0].mNumIndices;
            indices.resize(aim->mNumFaces * nIndicesPerFace);
            for (size_t i = 0; i < aim->mNumFaces; ++i) {
                for (size_t j = 0; j < nIndicesPerFace; ++j) {
                    indices[i*nIndicesPerFace + j] = IndicesType(aim->mFaces[i].mIndices[j]);
                }
            }

			p.indices = ExportData(*mAsset, meshId, b, indices.size(), &indices[0], AttribType::SCALAR, AttribType::SCALAR, ComponentType_UNSIGNED_INT, true);
		}

        switch (aim->mPrimitiveTypes) {
            case aiPrimitiveType_POLYGON:
                p.mode = PrimitiveMode_TRIANGLES; break; // TODO implement this
            case aiPrimitiveType_LINE:
                p.mode = PrimitiveMode_LINES; break;
            case aiPrimitiveType_POINT:
                p.mode = PrimitiveMode_POINTS; break;
            default: // aiPrimitiveType_TRIANGLE
                p.mode = PrimitiveMode_TRIANGLES;
        }

        /*************** Skins ****************/
        if(aim->HasBones()) {
            ExportSkin(*mAsset, aim, m, b, skinRef, inverseBindMatricesData);
        }
    }

    //----------------------------------------
    // Finish the skin
    // Create the Accessor for skinRef->inverseBindMatrices
    if (createSkin) {
        mat4* invBindMatrixData = new mat4[inverseBindMatricesData.size()];
        for ( unsigned int idx_joint = 0; idx_joint < inverseBindMatricesData.size(); ++idx_joint) {
            CopyValue(inverseBindMatricesData[idx_joint], invBindMatrixData[idx_joint]);
        }

        Ref<Accessor> invBindMatrixAccessor = ExportData(*mAsset, skinName, b,
                static_cast<unsigned int>(inverseBindMatricesData.size()),
            invBindMatrixData, AttribType::MAT4, AttribType::MAT4, ComponentType_FLOAT);
        if (invBindMatrixAccessor) {
            skinRef->inverseBindMatrices = invBindMatrixAccessor;
        }

        // Identity Matrix   =====>  skinRef->bindShapeMatrix
        // Temporary. Hard-coded identity matrix here
        skinRef->bindShapeMatrix.isPresent = true;
        IdentityMatrix4(skinRef->bindShapeMatrix.value);

        // Find nodes that contain a mesh with bones and add "skeletons" and "skin" attributes to those nodes.
        Ref<Node> rootNode = mAsset->nodes.Get(unsigned(0));
        Ref<Node> meshNode;
        for (unsigned int meshIndex = 0; meshIndex < mAsset->meshes.Size(); ++meshIndex) {
            Ref<Mesh> mesh = mAsset->meshes.Get(meshIndex);
            bool hasBones = false;
            for (unsigned int i = 0; i < mesh->primitives.size(); ++i) {
                if (!mesh->primitives[i].attributes.weight.empty()) {
                    hasBones = true;
                    break;
                }
            }
            if (!hasBones) {
                continue;
            }
            std::string meshID = mesh->id;
            FindMeshNode(rootNode, meshNode, meshID);
            Ref<Node> rootJoint = FindSkeletonRootJoint(skinRef);
            meshNode->skeletons.push_back(rootJoint);
            meshNode->skin = skinRef;
        }
        delete[] invBindMatrixData;
    }
}